

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  int iVar1;
  int odd_local;
  secp256k1_fe *x_local;
  secp256k1_ge *r_local;
  
  iVar1 = secp256k1_ge_set_xquad(r,x);
  if (iVar1 == 0) {
    r_local._4_4_ = 0;
  }
  else {
    secp256k1_fe_normalize_var(&r->y);
    iVar1 = secp256k1_fe_is_odd(&r->y);
    if (iVar1 != odd) {
      secp256k1_fe_negate(&r->y,&r->y,1);
    }
    r_local._4_4_ = 1;
  }
  return r_local._4_4_;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    if (!secp256k1_ge_set_xquad(r, x)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }
    return 1;

}